

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

void __thiscall CFG::CFG(CFG *this,Addr addr)

{
  CfgNode *this_00;
  allocator local_19;
  Addr local_18;
  Addr addr_local;
  CFG *this_local;
  
  this->_vptr_CFG = (_func_int **)&PTR__CFG_0013b9a0;
  this->m_addr = addr;
  this->m_status = UNCHECKED;
  local_18 = addr;
  addr_local = (Addr)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->m_functionName,"unknown",&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  this_00 = (CfgNode *)operator_new(0x78);
  CfgNode::CfgNode(this_00,CFG_ENTRY);
  this->m_entryNode = this_00;
  this->m_exitNode = (CfgNode *)0x0;
  this->m_haltNode = (CfgNode *)0x0;
  std::
  map<unsigned_long,_CfgNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgNode_*>_>_>
  ::map(&this->m_nodesMap);
  return;
}

Assistant:

CFG::CFG(Addr addr) : m_addr(addr), m_status(CFG::UNCHECKED),
		m_functionName("unknown"),
		m_entryNode(new CfgNode(CfgNode::CFG_ENTRY)),
		m_exitNode(0), m_haltNode(0) {
}